

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall
paraglob::ParaglobNode::merge_matches
          (ParaglobNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *target,string *text)

{
  string *in_RDX;
  long in_RDI;
  anon_class_32_1_8991f22b *__pred;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff98;
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *local_18;
  
  __pred = (anon_class_32_1_8991f22b *)(in_RDI + 0x20);
  local_18 = in_RDX;
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(in_stack_ffffffffffffff78);
  local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(in_stack_ffffffffffffff78);
  local_30 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (in_stack_ffffffffffffff78);
  __result.container =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_50;
  std::__cxx11::string::string((string *)__result.container,local_18);
  std::
  copy_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,paraglob::ParaglobNode::merge_matches(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,__result,__pred);
  const::{lambda(std::__cxx11::string_const&)#1}::~vector((anon_class_32_1_8991f22b *)0x10915a);
  return;
}

Assistant:

void merge_matches(std::vector<std::string>& target, const std::string& text) const {
    std::copy_if(patterns.begin(), patterns.end(),
                 std::back_inserter(target),
                 [text](const std::string& candidate) {
                   return (fnmatch(candidate.c_str(), text.c_str(), 0) == 0);
                 });
  }